

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O1

void * __thiscall Centaurus::Stage1Runner::feed_callback(Stage1Runner *this)

{
  int *piVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  void *in_RCX;
  bool bVar5;
  long lVar6;
  bool bVar7;
  
  release_bank(this);
  pvVar3 = (this->super_BaseRunner).m_sub_window;
  do {
    iVar2 = (this->super_BaseRunner).m_bank_num;
    bVar5 = 0 < iVar2;
    if (0 < iVar2) {
      lVar6 = 0;
      do {
        piVar1 = (int *)((long)pvVar3 + lVar6 * 8 + 4);
        LOCK();
        bVar7 = *piVar1 == 0;
        if (bVar7) {
          *piVar1 = 1;
        }
        UNLOCK();
        if (bVar7) {
          this->m_current_bank = (int)lVar6;
          in_RCX = (void *)((this->super_BaseRunner).m_bank_size * lVar6 +
                           (long)(this->super_BaseRunner).m_main_window);
          break;
        }
        lVar6 = lVar6 + 1;
        lVar4 = (long)(this->super_BaseRunner).m_bank_num;
        bVar5 = lVar6 < lVar4;
      } while (lVar6 < lVar4);
    }
    if (bVar5) {
      return in_RCX;
    }
  } while( true );
}

Assistant:

virtual void *feed_callback() override
  {
    release_bank();
    return acquire_bank();
  }